

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

bool find_files(string *pathname,string *filename,string_array *files,bool recursive)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  DIR *__dirp;
  dirent64 *__rhs;
  size_type sVar6;
  byte in_CL;
  value_type *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *path;
  uint i;
  string filename_1;
  bool is_file;
  bool is_directory;
  dirent *ep;
  string_array paths;
  DIR *dp;
  char c;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  uint local_ac;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [34];
  byte local_5e;
  byte local_5d;
  dirent64 *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined8 uVar7;
  undefined6 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffde;
  value_type *pvVar8;
  bool local_1;
  
  bVar1 = in_CL & 1;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    in_stack_ffffffffffffffde = *pcVar5;
    if (((in_stack_ffffffffffffffde != ':') && (in_stack_ffffffffffffffde != '\\')) &&
       (in_stack_ffffffffffffffde != '/')) {
      std::__cxx11::string::operator+=((string *)in_RDI,"/");
    }
  }
  pcVar5 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar5);
  if (__dirp == (DIR *)0x0) {
    local_1 = false;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x113f85);
    while (__rhs = readdir64(__dirp), local_50 = __rhs, __rhs != (dirent64 *)0x0) {
      local_5d = (__rhs->d_type & 4) != 0;
      local_5e = (__rhs->d_type & 8) != 0;
      if (__rhs->d_name[0] != '.') {
        in_stack_ffffffffffffff00 = __rhs->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (allocator<char> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        std::allocator<char>::~allocator(&local_81);
        if ((local_5d & 1) == 0) {
          if ((local_5e & 1) != 0) {
            pvVar8 = in_RDX;
            std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__rhs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(in_stack_fffffffffffffef0,
                        (value_type *)
                        CONCAT17(in_stack_fffffffffffffeef,
                                 CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
            std::__cxx11::string::~string(local_a8);
            in_stack_fffffffffffffef8 = in_RDX;
            in_RDX = pvVar8;
          }
        }
        else if ((bVar1 & 1) != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        }
        std::__cxx11::string::~string(local_80);
      }
    }
    closedir(__dirp);
    uVar7 = 0;
    if ((bVar1 & 1) != 0) {
      local_ac = 0;
      while( true ) {
        uVar4 = (ulong)local_ac;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_48);
        if (sVar6 <= uVar4) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_48,(ulong)local_ac);
        std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs);
        bVar2 = find_files(in_RSI,in_RDX,
                           (string_array *)
                           CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffde,
                                                   in_stack_ffffffffffffffd8)),
                           SUB81((ulong)uVar7 >> 0x38,0));
        bVar3 = bVar2 ^ 0xff;
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
        if ((bVar3 & 1) != 0) {
          local_1 = false;
          goto LAB_0011428a;
        }
        local_ac = local_ac + 1;
      }
    }
    local_1 = true;
LAB_0011428a:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffff00);
  }
  return local_1;
}

Assistant:

static bool find_files(std::string pathname, const std::string &filename, string_array &files, bool recursive)
{
   if (!pathname.empty())
   {
      char c = pathname[pathname.size() - 1];
      if ((c != ':') && (c != '\\') && (c != '/'))
         pathname += "/";
   }

   DIR *dp = opendir(pathname.c_str());

   if (!dp)
      return false;

   string_array paths;

   for ( ; ; )
   {
      struct dirent *ep = readdir(dp);
      if (!ep)
         break;

      const bool is_directory = (ep->d_type & DT_DIR) != 0;
      const bool is_file =  (ep->d_type & DT_REG) != 0;

      if (ep->d_name[0] == '.')
         continue;

      std::string filename(ep->d_name);

      if (is_directory)
      {
         if (recursive)
            paths.push_back(filename);
      }
      else if (is_file)
         files.push_back(pathname + filename);
   }

   closedir(dp);
   dp = NULL;

   if (recursive)
   {
      for (uint i = 0; i < paths.size(); i++)
      {
         const std::string &path = paths[i];
         if (!find_files(pathname + path, filename, files, true))
            return false;
      }
   }

   return true;
}